

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *args_1;
  Token *args;
  RsWeightClauseSyntax *pRVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  RsProdSyntax *in_stack_ffffffffffffffc0;
  BumpAllocator *this;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  this = TVar2._0_8_;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x599ce3);
  args_1 = deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(__fn + 0x30) == 0) {
    args = (Token *)0x0;
  }
  else {
    args = (Token *)deepClone<slang::syntax::RsProdSyntax>
                              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsWeightClauseSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::RsProdSyntax*>
                     (this,args,args_1,(RsProdSyntax **)__child_stack);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsWeightClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsWeightClauseSyntax>(
        node.colonEqual.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.weight, alloc),
        node.codeBlock ? deepClone(*node.codeBlock, alloc) : nullptr
    );
}